

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O1

void Ptex::v2_2::(anonymous_namespace)::Apply<unsigned_char,3>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int param_5)

{
  ushort *puVar1;
  float fVar2;
  byte bVar3;
  int iVar4;
  float *pfVar5;
  float *pfVar6;
  ushort *puVar7;
  float *pfVar8;
  ushort *puVar9;
  int iVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  bVar3 = (k->res).ulog2;
  iVar10 = 3 << (bVar3 & 0x1f);
  if (k->vw != 0) {
    puVar9 = (ushort *)((long)data + ((long)(k->v << (bVar3 & 0x1f)) + (long)k->u) * 3);
    puVar7 = (ushort *)((long)(k->vw * iVar10) + (long)puVar9);
    pfVar8 = k->kv;
    iVar4 = k->uw;
    pfVar5 = k->ku;
    do {
      fVar14 = *pfVar5;
      fVar12 = (float)(byte)puVar9[1] * fVar14;
      fVar13 = fVar14 * (float)(*puVar9 & 0xff);
      fVar14 = fVar14 * (float)(byte)(*puVar9 >> 8);
      lVar11 = (long)(iVar4 * 3) + -3;
      pfVar6 = pfVar5;
      if (iVar4 != 1) {
        do {
          puVar1 = (ushort *)((long)puVar9 + 3);
          fVar2 = pfVar6[1];
          fVar13 = fVar13 + fVar2 * (float)(*(ushort *)((long)puVar9 + 3) & 0xff);
          fVar14 = fVar14 + fVar2 * (float)(byte)(*(ushort *)((long)puVar9 + 3) >> 8);
          fVar12 = fVar12 + (float)*(byte *)((long)puVar9 + 5) * fVar2;
          lVar11 = lVar11 + -3;
          puVar9 = puVar1;
          pfVar6 = pfVar6 + 1;
        } while (lVar11 != 0);
      }
      fVar2 = *pfVar8;
      *(ulong *)result =
           CONCAT44(fVar2 * fVar14 + (float)((ulong)*(undefined8 *)result >> 0x20),
                    fVar2 * fVar13 + (float)*(undefined8 *)result);
      pfVar8 = pfVar8 + 1;
      result[2] = fVar12 * fVar2 + result[2];
      puVar9 = (ushort *)((long)puVar9 + (long)(iVar10 + iVar4 * -3) + 3);
    } while (puVar9 != puVar7);
  }
  return;
}

Assistant:

int u() const { return 1<<(unsigned)ulog2; }